

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strtoupper(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 in_RAX;
  char *zString;
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  uint uVar3;
  char *pcVar4;
  int c;
  int nLen;
  undefined8 local_38;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    local_38 = in_RAX;
    zString = jx9_value_to_string(*apArg,(int *)((long)&local_38 + 4));
    if ((long)local_38._4_4_ < 1) {
      jx9_value_string(pCtx->pRet,"",0);
    }
    else {
      pcVar4 = zString + local_38._4_4_;
      do {
        uVar3 = (uint)*zString;
        if (uVar3 < 0xffffffc0) {
          local_38 = CONCAT44(local_38._4_4_,uVar3);
          ppuVar1 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar1 + (long)(int)uVar3 * 2 + 1) & 2) != 0) {
            pp_Var2 = __ctype_toupper_loc();
            local_38 = CONCAT44(local_38._4_4_,(*pp_Var2)[*zString]);
          }
          jx9_value_string(pCtx->pRet,(char *)&local_38,1);
        }
        else {
          jx9_value_string(pCtx->pRet,zString,1);
        }
        zString = zString + 1;
      } while (zString < pcVar4);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtoupper(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zCur, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zString[nLen];
	for(;;){
		if( zString >= zEnd ){
			/* No more input, break immediately */
			break;
		}
		if( (unsigned char)zString[0] >= 0xc0 ){
			/* UTF-8 stream, output verbatim */
			zCur = zString;
			zString++;
			while( zString < zEnd && ((unsigned char)zString[0] & 0xc0) == 0x80){
				zString++;
			}
			/* Append UTF-8 stream */
			jx9_result_string(pCtx, zCur, (int)(zString-zCur));
		}else{
			int c = zString[0];
			if( SyisLower(c) ){
				c = SyToUpper(zString[0]);
			}
			/* Append character */
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			/* Advance the cursor */
			zString++;
		}
	}
	return JX9_OK;
}